

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makePointer(TranslateToFuzzReader *this)

{
  bool bVar1;
  Expression *left;
  Const *right;
  Binary *pBVar2;
  Builder *this_00;
  BinaryOp BStack_20;
  
  left = make(this,(Type)*(uintptr_t *)
                          ((long)(((this->wasm->memories).
                                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                          + 0x50));
  if (this->allowOOB == true) {
    bVar1 = Random::oneIn(&this->random,10);
    if (bVar1) {
      return left;
    }
  }
  this_00 = &this->builder;
  if (*(long *)((long)(((this->wasm->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x50
               ) == 3) {
    right = Builder::makeConst<long>(this_00,0xf);
    BStack_20 = AndInt64;
  }
  else {
    right = Builder::makeConst<int>(this_00,0xf);
    BStack_20 = AndInt32;
  }
  pBVar2 = Builder::makeBinary(this_00,BStack_20,left,(Expression *)right);
  return (Expression *)pBVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makePointer() {
  auto* ret = make(wasm.memories[0]->indexType);
  // with high probability, mask the pointer so it's in a reasonable
  // range. otherwise, most pointers are going to be out of range and
  // most memory ops will just trap
  if (!allowOOB || !oneIn(10)) {
    if (wasm.memories[0]->is64()) {
      ret = builder.makeBinary(
        AndInt64, ret, builder.makeConst(int64_t(USABLE_MEMORY - 1)));
    } else {
      ret = builder.makeBinary(
        AndInt32, ret, builder.makeConst(int32_t(USABLE_MEMORY - 1)));
    }
  }
  return ret;
}